

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall
SimpleStringInternalCache::releaseCachedBlockFrom
          (SimpleStringInternalCache *this,char *memory,SimpleStringInternalCacheNode *node)

{
  SimpleStringMemoryBlock *pSVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  SimpleStringMemoryBlock *block;
  SimpleStringMemoryBlock *pSVar4;
  SimpleStringMemoryBlock *blockToFree;
  bool bVar5;
  SimpleString SStack_28;
  
  pSVar4 = node->usedMemoryHead_;
  if ((pSVar4 != (SimpleStringMemoryBlock *)0x0) && (pSVar4->memory_ == memory)) {
    node->usedMemoryHead_ = pSVar4->next_;
    pSVar4->next_ = node->freeMemoryHead_;
    node->freeMemoryHead_ = pSVar4;
    return;
  }
  pSVar4 = node->usedMemoryHead_;
  bVar5 = pSVar4 == (SimpleStringMemoryBlock *)0x0;
  if (!bVar5) {
    while ((pSVar1 = pSVar4->next_, pSVar1 == (SimpleStringMemoryBlock *)0x0 ||
           (pSVar1->memory_ != memory))) {
      pSVar4 = pSVar4->next_;
      bVar5 = pSVar4 == (SimpleStringMemoryBlock *)0x0;
      if (bVar5) {
        printDeallocatingUnknownMemory(this,memory);
        return;
      }
    }
    pSVar4->next_ = pSVar1->next_;
    pSVar1->next_ = node->freeMemoryHead_;
    node->freeMemoryHead_ = pSVar1;
    if (!bVar5) {
      return;
    }
  }
  if (this->hasWarnedAboutDeallocations == false) {
    this->hasWarnedAboutDeallocations = true;
    pUVar2 = UtestShell::getCurrent();
    StringFromFormat((char *)&SStack_28,
                     "\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\nThis is likely due statics and will cause problems.\nOnly warning once to avoid recursive warnings.\nString we are deallocating: \"%s\"\n"
                     ,memory);
    pcVar3 = SimpleString::asCharString(&SStack_28);
    (*pUVar2->_vptr_UtestShell[0x1c])
              (pUVar2,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
               ,0x9e);
    SimpleString::~SimpleString(&SStack_28);
  }
  return;
}

Assistant:

void SimpleStringInternalCache::releaseCachedBlockFrom(char* memory, SimpleStringInternalCacheNode* node)
{
    if (node->usedMemoryHead_ && node->usedMemoryHead_->memory_ == memory) {
        SimpleStringMemoryBlock* block = node->usedMemoryHead_;
        node->usedMemoryHead_ = node->usedMemoryHead_->next_;
        node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->freeMemoryHead_);
        return;
    }

    for (SimpleStringMemoryBlock* block = node->usedMemoryHead_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(blockToFree, node->freeMemoryHead_);
            return;
        }
    }
    printDeallocatingUnknownMemory(memory);

}